

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkHin(ARKodeMem ark_mem,sunrealtype tout)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sunrealtype sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  sunrealtype sVar12;
  sunrealtype yddnrm;
  double local_50;
  undefined1 local_48 [16];
  ulong local_38;
  undefined8 uStack_30;
  
  dVar8 = tout - ark_mem->tcur;
  iVar1 = -0x1b;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    dVar9 = ABS(ark_mem->tcur);
    if (dVar9 <= ABS(tout)) {
      dVar9 = ABS(tout);
    }
    dVar9 = dVar9 * ark_mem->uround;
    if (dVar9 + dVar9 <= ABS(dVar8)) {
      if (ark_mem->fn_is_current == 0) {
        iVar1 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,0);
        if (iVar1 != 0) {
          return -8;
        }
        ark_mem->fn_is_current = 1;
      }
      dVar9 = dVar9 * 100.0;
      sVar4 = arkUpperBoundH0(ark_mem,ABS(dVar8));
      uVar11 = (undefined4)((ulong)sVar4 >> 0x20);
      dVar5 = dVar9 * sVar4;
      sVar12 = 0.0;
      local_48._8_4_ = (int)extraout_XMM0_Qb;
      local_48._0_8_ = sVar4;
      local_48._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
      uVar10 = SUB84(sVar4,0);
      if (0.0 < dVar5) {
        if (dVar5 < 0.0) {
          sVar12 = sqrt(dVar5);
          uVar10 = local_48._0_4_;
          uVar11 = local_48._4_4_;
        }
        else {
          sVar12 = SQRT(dVar5);
        }
      }
      if (dVar9 < (double)CONCAT44(uVar11,uVar10) || dVar9 == (double)CONCAT44(uVar11,uVar10)) {
        local_38 = -(ulong)(dVar8 <= 0.0);
        uStack_30 = 0;
        iVar2 = arkYddNorm(ark_mem,(sunrealtype)
                                   (~local_38 & (ulong)sVar12 | (ulong)-sVar12 & local_38),&local_50
                          );
        iVar1 = -8;
        if (-1 < iVar2) {
          uVar3 = 1;
          do {
            if ((double)local_48._0_8_ * local_50 * (double)local_48._0_8_ <= 2.0) {
              dVar5 = (double)local_48._0_8_ * sVar12;
            }
            else {
              dVar5 = 2.0 / local_50;
            }
            dVar6 = 0.0;
            if (0.0 < dVar5) {
              if (dVar5 < 0.0) {
                dVar6 = sqrt(dVar5);
              }
              else {
                dVar6 = SQRT(dVar5);
              }
            }
            dVar5 = dVar6;
            if (((uVar3 == 4) || ((dVar7 = dVar6 / sVar12, 0.5 < dVar7 && (dVar7 < 2.0)))) ||
               ((1 < uVar3 && (dVar5 = sVar12, 2.0 < dVar7)))) {
              if (dVar9 <= dVar5 * 0.5) {
                dVar9 = dVar5 * 0.5;
              }
              if (dVar9 <= (double)local_48._0_8_) {
                local_48._0_8_ = dVar9;
              }
              sVar12 = (sunrealtype)
                       (-(ulong)(dVar8 <= 0.0) & (ulong)-(double)local_48._0_8_ |
                       ~-(ulong)(dVar8 <= 0.0) & local_48._0_8_);
              goto LAB_00151add;
            }
            uVar3 = uVar3 + 1;
            iVar2 = arkYddNorm(ark_mem,(sunrealtype)
                                       (~local_38 & (ulong)dVar6 | (ulong)-dVar6 & local_38),
                               &local_50);
            sVar12 = dVar6;
          } while (-1 < iVar2);
        }
      }
      else {
        if (dVar8 <= 0.0) {
          sVar12 = -sVar12;
        }
LAB_00151add:
        ark_mem->h = sVar12;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkHin(ARKodeMem ark_mem, sunrealtype tout)
{
  int retval, sign, count1, count2;
  sunrealtype tdiff, tdist, tround, hlb, hub;
  sunrealtype hg, hgs, hs, hnew, hrat, h0, yddnrm;
  sunbooleantype hgOK;

  /* If tout is too close to tn, give up */
  if ((tdiff = tout - ark_mem->tcur) == ZERO) { return (ARK_TOO_CLOSE); }

  sign   = (tdiff > ZERO) ? 1 : -1;
  tdist  = SUNRabs(tdiff);
  tround = ark_mem->uround * SUNMAX(SUNRabs(ark_mem->tcur), SUNRabs(tout));

  if (tdist < TWO * tround) { return (ARK_TOO_CLOSE); }

  /* call full RHS if needed */
  if (!(ark_mem->fn_is_current))
  {
    /* NOTE: The step size (h) is used in setting the tolerance in a potential
       mass matrix solve when computing the full RHS. Before calling arkHin, h
       is set to |tout - tcur| or 1 and so we do not need to guard against
       h == 0 here before calling the full RHS. */
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                   ark_mem->fn, ARK_FULLRHS_START);
    if (retval) { return ARK_RHSFUNC_FAIL; }
    ark_mem->fn_is_current = SUNTRUE;
  }

  /* Set lower and upper bounds on h0, and take geometric mean
     as first trial value.
     Exit with this value if the bounds cross each other. */
  hlb = H0_LBFACTOR * tround;
  hub = arkUpperBoundH0(ark_mem, tdist);

  hg = SUNRsqrt(hlb * hub);

  if (hub < hlb)
  {
    if (sign == -1) { ark_mem->h = -hg; }
    else { ark_mem->h = hg; }
    return (ARK_SUCCESS);
  }

  /* Outer loop */
  hs = hg; /* safeguard against 'uninitialized variable' warning */
  for (count1 = 1; count1 <= H0_ITERS; count1++)
  {
    /* Attempts to estimate ydd */
    hgOK = SUNFALSE;

    for (count2 = 1; count2 <= H0_ITERS; count2++)
    {
      hgs    = hg * sign;
      retval = arkYddNorm(ark_mem, hgs, &yddnrm);
      /* If f() failed unrecoverably, give up */
      if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
      /* If successful, we can use ydd */
      if (retval == ARK_SUCCESS)
      {
        hgOK = SUNTRUE;
        break;
      }
      /* f() failed recoverably; cut step size and test it again */
      hg *= SUN_RCONST(0.2);
    }

    /* If f() failed recoverably H0_ITERS times */
    if (!hgOK)
    {
      /* Exit if this is the first or second pass. No recovery possible */
      if (count1 <= 2) { return (ARK_REPTD_RHSFUNC_ERR); }
      /* We have a fall-back option. The value hs is a previous hnew which
         passed through f(). Use it and break */
      hnew = hs;
      break;
    }

    /* The proposed step size is feasible. Save it. */
    hs = hg;

    /* Propose new step size */
    hnew = (yddnrm * hub * hub > TWO) ? SUNRsqrt(TWO / yddnrm)
                                      : SUNRsqrt(hg * hub);

    /* If last pass, stop now with hnew */
    if (count1 == H0_ITERS) { break; }

    hrat = hnew / hg;

    /* Accept hnew if it does not differ from hg by more than a factor of 2 */
    if ((hrat > HALF) && (hrat < TWO)) { break; }

    /* After one pass, if ydd seems to be bad, use fall-back value. */
    if ((count1 > 1) && (hrat > TWO))
    {
      hnew = hg;
      break;
    }

    /* Send this value back through f() */
    hg = hnew;
  }

  /* Apply bounds, bias factor, and attach sign */
  h0 = H0_BIAS * hnew;
  if (h0 < hlb) { h0 = hlb; }
  if (h0 > hub) { h0 = hub; }
  if (sign == -1) { h0 = -h0; }
  ark_mem->h = h0;

  return (ARK_SUCCESS);
}